

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNNValidatorTests.cpp
# Opt level: O2

void CoreML::KNNValidatorTests::addIntLabels(KNearestNeighborsClassifier *nnModel)

{
  Int64Vector *pIVar1;
  
  pIVar1 = Specification::KNearestNeighborsClassifier::mutable_int64classlabels(nnModel);
  Specification::Int64Vector::add_vector(pIVar1,0);
  pIVar1 = Specification::KNearestNeighborsClassifier::mutable_int64classlabels(nnModel);
  Specification::Int64Vector::add_vector(pIVar1,0);
  pIVar1 = Specification::KNearestNeighborsClassifier::mutable_int64classlabels(nnModel);
  Specification::Int64Vector::add_vector(pIVar1,0);
  pIVar1 = Specification::KNearestNeighborsClassifier::mutable_int64classlabels(nnModel);
  Specification::Int64Vector::add_vector(pIVar1,0);
  pIVar1 = Specification::KNearestNeighborsClassifier::mutable_int64classlabels(nnModel);
  Specification::Int64Vector::add_vector(pIVar1,0);
  pIVar1 = Specification::KNearestNeighborsClassifier::mutable_int64classlabels(nnModel);
  Specification::Int64Vector::add_vector(pIVar1,0);
  return;
}

Assistant:

void addIntLabels(Specification::KNearestNeighborsClassifier* nnModel) {

        nnModel->mutable_int64classlabels()->add_vector(0);
        nnModel->mutable_int64classlabels()->add_vector(0);
        nnModel->mutable_int64classlabels()->add_vector(0);

        nnModel->mutable_int64classlabels()->add_vector(0);
        nnModel->mutable_int64classlabels()->add_vector(0);
        nnModel->mutable_int64classlabels()->add_vector(0);

    }